

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-utils.cpp
# Opt level: O3

void setupStackTraceOnError(int argc,char **argv)

{
  PrettyStackTraceProgram X;
  code *local_38 [2];
  int local_28;
  char **local_20;
  
  llvm::sys::PrintStackTraceOnErrorSignal((StringRef)ZEXT816(0),false);
  llvm::PrettyStackTraceEntry::PrettyStackTraceEntry((PrettyStackTraceEntry *)local_38);
  local_38[0] = std::__throw_bad_alloc;
  local_28 = argc;
  local_20 = argv;
  llvm::EnablePrettyStackTrace();
  llvm::PrettyStackTraceEntry::~PrettyStackTraceEntry((PrettyStackTraceEntry *)local_38);
  return;
}

Assistant:

void setupStackTraceOnError(int argc, char *argv[]) {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 9
    llvm::sys::PrintStackTraceOnErrorSignal();
#else
    llvm::sys::PrintStackTraceOnErrorSignal(llvm::StringRef());
#endif
    llvm::PrettyStackTraceProgram X(argc, argv);
}